

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O2

ctmbstr tidyOptGetDefault(TidyOption topt)

{
  TidyOptionImpl *pTVar1;
  ctmbstr ptVar2;
  TidyOptionImpl *option;
  
  if (topt != (TidyOption)0x0) {
    if (topt->_opaque == 0xd) {
      pTVar1 = prvTidygetOption(TidyDoctypeMode);
      ptVar2 = prvTidyGetPickListLabelForPick(TidyDoctypeMode,(uint)pTVar1->dflt);
      return ptVar2;
    }
    if (topt[4]._opaque == 0) {
      return *(ctmbstr *)(topt + 0xc);
    }
  }
  return (ctmbstr)0x0;
}

Assistant:

ctmbstr TIDY_CALL       tidyOptGetDefault( TidyOption topt )
{
    const TidyOptionImpl* option = tidyOptionToImpl( topt );
    /* Special case for TidyDoctype, because it is declared as string */
    if ( option && option->id == TidyDoctype )
    {
        const TidyOptionImpl* newopt = TY_(getOption)( TidyDoctypeMode );
        return TY_(GetPickListLabelForPick)( TidyDoctypeMode, newopt->dflt );
    }
    if ( option && option->type == TidyString )
        return option->pdflt; /* Issue #306 - fix an old typo hidden by a cast! */
    return NULL;
}